

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::HaveCStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  char **ppcVar6;
  bool bVar7;
  bool bVar8;
  char **local_760;
  cmStrCmp local_648;
  byte local_621;
  cmStrCmp local_620;
  byte local_5f9;
  cmStrCmp local_5f8;
  byte local_5d1;
  cmStrCmp local_5d0;
  char **local_5b0;
  char **existingCIt;
  ostringstream local_588 [8];
  ostringstream e_2;
  cmStrCmp local_410;
  allocator<char> local_3e9;
  string local_3e8;
  char *local_3c8;
  char *existingCStandard;
  undefined1 local_3b8 [5];
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream local_398 [8];
  ostringstream e_1;
  cmStrCmp local_220;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *defaultCStandard;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  defaultCStandard = (char *)feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_C_STANDARD_DEFAULT",&local_51);
  pcVar1 = GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,
                    "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::ostringstream::str();
    IssueMessage(this,INTERNAL_ERROR,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  else {
    ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::cmStrCmp(&local_220,local_30);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_220);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_220);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar4 = std::operator<<((ostream *)local_398,
                               "The CMAKE_C_STANDARD_DEFAULT variable contains an invalid value: \""
                              );
      poVar4 = std::operator<<(poVar4,local_30);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,INTERNAL_ERROR,(string *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_398);
    }
    else {
      existingCStandard._7_1_ = 0;
      existingCStandard._6_1_ = 0;
      existingCStandard._5_1_ = 0;
      CheckNeededCLanguage
                (this,(string *)defaultCStandard,(bool *)((long)&existingCStandard + 7),
                 (bool *)((long)&existingCStandard + 6),(bool *)((long)&existingCStandard + 5));
      psVar5 = feature_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"C_STANDARD",&local_3e9);
      pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      local_3c8 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        local_3c8 = local_30;
      }
      ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
      ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
      cmStrCmp::cmStrCmp(&local_410,local_3c8);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_410);
      ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
      cmStrCmp::~cmStrCmp(&local_410);
      if (ppcVar2 == ppcVar3) {
        std::__cxx11::ostringstream::ostringstream(local_588);
        poVar4 = std::operator<<((ostream *)local_588,"The C_STANDARD property on target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
        poVar4 = std::operator<<(poVar4,local_3c8);
        std::operator<<(poVar4,"\".");
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,(string *)&existingCIt);
        std::__cxx11::string::~string((string *)&existingCIt);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_588);
      }
      else {
        local_5d1 = 0;
        if (local_3c8 == (char *)0x0) {
          local_760 = std::cend<char_const*[3]>(&C_STANDARDS);
        }
        else {
          ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
          ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
          cmStrCmp::cmStrCmp(&local_5d0,local_3c8);
          local_5d1 = 1;
          local_760 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_5d0);
        }
        if ((local_5d1 & 1) != 0) {
          cmStrCmp::~cmStrCmp(&local_5d0);
        }
        local_5b0 = local_760;
        local_5f9 = 0;
        bVar7 = false;
        if (((existingCStandard._5_1_ & 1) != 0) && (bVar7 = false, local_3c8 != (char *)0x0)) {
          ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
          ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
          cmStrCmp::cmStrCmp(&local_5f8,"11");
          local_5f9 = 1;
          ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_5f8);
          bVar7 = local_760 < ppcVar2;
        }
        if ((local_5f9 & 1) != 0) {
          cmStrCmp::~cmStrCmp(&local_5f8);
        }
        ppcVar2 = local_5b0;
        if (bVar7) {
          this_local._7_1_ = 0;
        }
        else {
          local_621 = 0;
          bVar7 = false;
          if (((existingCStandard._6_1_ & 1) != 0) && (bVar7 = false, local_3c8 != (char *)0x0)) {
            ppcVar3 = std::cbegin<char_const*[3]>(&C_STANDARDS);
            ppcVar6 = std::cend<char_const*[3]>(&C_STANDARDS);
            cmStrCmp::cmStrCmp(&local_620,"99");
            local_621 = 1;
            ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_620);
            bVar7 = ppcVar2 < ppcVar3;
          }
          if ((local_621 & 1) != 0) {
            cmStrCmp::~cmStrCmp(&local_620);
          }
          ppcVar2 = local_5b0;
          if (bVar7) {
            this_local._7_1_ = 0;
          }
          else {
            bVar7 = false;
            bVar8 = false;
            if (((existingCStandard._7_1_ & 1) != 0) && (bVar8 = false, local_3c8 != (char *)0x0)) {
              ppcVar3 = std::cbegin<char_const*[3]>(&C_STANDARDS);
              ppcVar6 = std::cend<char_const*[3]>(&C_STANDARDS);
              cmStrCmp::cmStrCmp(&local_648,"90");
              bVar7 = true;
              ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_648);
              bVar8 = ppcVar2 < ppcVar3;
            }
            if (bVar7) {
              cmStrCmp::~cmStrCmp(&local_648);
            }
            if (bVar8) {
              this_local._7_1_ = 0;
            }
            else {
              this_local._7_1_ = 1;
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::HaveCStandardAvailable(cmTarget const* target,
                                        const std::string& feature) const
{
  const char* defaultCStandard =
    this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
  if (!defaultCStandard) {
    std::ostringstream e;
    e << "CMAKE_C_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(defaultCStandard)) == cm::cend(C_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_C_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCStandard << "\".";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (!existingCStandard) {
    existingCStandard = defaultCStandard;
  }

  if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
    std::ostringstream e;
    e << "The C_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCStandard << "\".";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    return false;
  }
  if (needC99 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("99"))) {
    return false;
  }
  if (needC90 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("90"))) {
    return false;
  }
  return true;
}